

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O0

MPP_RET dpb_remove_frame(Avs2dCtx_t *p_dec,Avs2dFrame_t *p)

{
  MppBuffer local_30;
  MppBuffer buffer;
  MppFrame frame;
  Avs2dFrameMgr_t *mgr;
  Avs2dFrame_t *p_local;
  Avs2dCtx_t *p_dec_local;
  
  frame = &p_dec->frm_mgr;
  buffer = p->frame;
  mgr = (Avs2dFrameMgr_t *)p;
  p_local = (Avs2dFrame_t *)p_dec;
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_frame");
  }
  if ((*(int *)&mgr->dpb == 5) || (*(char *)((long)mgr->refs + 4) != '\0')) {
    local_30 = (MppBuffer)0x0;
    mpp_buf_slot_get_prop(p_local->frame,*(RK_S32 *)((long)&mgr->dpb + 4),SLOT_BUFFER,&local_30);
    mpp_buffer_put_with_caller(local_30,"dpb_remove_frame");
  }
  mpp_buf_slot_clr_flag(p_local->frame,*(RK_S32 *)((long)&mgr->dpb + 4),SLOT_CODEC_USE);
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","dpb remove frame slot_idx %d, doi %d poi %d, dpb used %d",
               "dpb_remove_frame",(ulong)*(uint *)((long)&mgr->dpb + 4),
               (ulong)*(uint *)&mgr->num_of_ref,*(undefined4 *)&mgr->field_0x1c,
               *(undefined4 *)((long)frame + 8));
  }
  memset(mgr,0,0x30);
  *(MppBuffer *)mgr = buffer;
  *(undefined4 *)((long)&mgr->dpb + 4) = 0xffffffff;
  *(undefined4 *)&mgr->num_of_ref = 0xffffffff;
  *(undefined4 *)&mgr->field_0x1c = 0xffffffff;
  *(int *)((long)frame + 8) = *(int *)((long)frame + 8) + -1;
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_frame");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET dpb_remove_frame(Avs2dCtx_t *p_dec, Avs2dFrame_t *p)
{
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;
    MppFrame frame = p->frame;

    avs2d_dbg_dpb("In.");

    if (p->picture_type == GB_PICTURE || p->invisible) {
        MppBuffer buffer = NULL;
        mpp_buf_slot_get_prop(p_dec->frame_slots, p->slot_idx, SLOT_BUFFER, &buffer);
        mpp_buffer_put(buffer);
    }

    mpp_buf_slot_clr_flag(p_dec->frame_slots, p->slot_idx, SLOT_CODEC_USE);
    avs2d_dbg_dpb("dpb remove frame slot_idx %d, doi %d poi %d, dpb used %d",
                  p->slot_idx, p->doi, p->poi, mgr->used_size);

    memset(p, 0, sizeof(Avs2dFrame_t));
    p->frame = frame;
    p->slot_idx = NO_VAL;
    p->doi = NO_VAL;
    p->poi = NO_VAL;
    mgr->used_size--;

    avs2d_dbg_dpb("Out.");
    return MPP_OK;
}